

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O1

void __thiscall xercesc_4_0::NamespaceScope::expandMap(NamespaceScope *this,StackElem *toExpand)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)toExpand->fMapCapacity;
  uVar2 = 0x10;
  if (uVar3 != 0) {
    uVar2 = (long)((double)uVar3 * 1.25) & 0xffffffff;
  }
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar2 * 8);
  memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar1),toExpand->fMap,uVar3 << 3);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,toExpand->fMap);
  toExpand->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar1);
  toExpand->fMapCapacity = (uint)uVar2;
  return;
}

Assistant:

void NamespaceScope::expandMap(StackElem* const toExpand)
{
    // For convenience get the old map size
    const unsigned int oldCap = toExpand->fMapCapacity;

    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const unsigned int newCapacity = oldCap ?
                                     (unsigned int)(oldCap * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    memcpy(newMap, toExpand->fMap, oldCap * sizeof(PrefMapElem));

    // Delete the old map and store the new stuff
    fMemoryManager->deallocate(toExpand->fMap);//delete [] toExpand->fMap;
    toExpand->fMap = newMap;
    toExpand->fMapCapacity = newCapacity;
}